

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

void __thiscall
vkt::pipeline::anon_unknown_0::MultisampleRenderer::MultisampleRenderer
          (MultisampleRenderer *this,Context *context,VkFormat colorFormat,IVec2 *renderSize,
          VkPrimitiveTopology topology,
          vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *vertices,
          VkPipelineMultisampleStateCreateInfo *multisampleStateParams,
          VkPipelineColorBlendAttachmentState *blendState)

{
  void *pvVar1;
  VkSampleMask *pVVar2;
  undefined4 uVar3;
  VkPipelineMultisampleStateCreateFlags VVar4;
  VkSampleCountFlagBits VVar5;
  VkBool32 VVar6;
  float fVar7;
  VkBool32 VVar8;
  VkBool32 VVar9;
  VkBlendFactor VVar10;
  VkBlendFactor VVar11;
  VkBlendOp VVar12;
  VkBlendFactor VVar13;
  VkBlendFactor VVar14;
  VkBlendOp VVar15;
  VkColorComponentFlags VVar16;
  VkPrimitiveTopology local_94 [7];
  Move<vk::Handle<(vk::HandleType)14>_> *local_78;
  Move<vk::Handle<(vk::HandleType)14>_> *local_70;
  Move<vk::Handle<(vk::HandleType)23>_> *local_68;
  Move<vk::Handle<(vk::HandleType)17>_> *local_60;
  Move<vk::Handle<(vk::HandleType)9>_> *local_58;
  Move<vk::Handle<(vk::HandleType)13>_> *local_50;
  Move<vk::Handle<(vk::HandleType)9>_> *local_48;
  Move<vk::Handle<(vk::HandleType)13>_> *local_40;
  Move<vk::Handle<(vk::HandleType)9>_> *local_38;
  
  this->_vptr_MultisampleRenderer = (_func_int **)&PTR__MultisampleRenderer_00d28918;
  this->m_context = context;
  this->m_colorFormat = colorFormat;
  this->m_depthStencilFormat = VK_FORMAT_UNDEFINED;
  (this->m_renderSize).m_data[0] = renderSize->m_data[0];
  (this->m_renderSize).m_data[1] = renderSize->m_data[1];
  this->m_useDepth = false;
  this->m_useStencil = false;
  uVar3 = *(undefined4 *)&multisampleStateParams->field_0x4;
  pvVar1 = multisampleStateParams->pNext;
  VVar4 = multisampleStateParams->flags;
  VVar5 = multisampleStateParams->rasterizationSamples;
  VVar6 = multisampleStateParams->sampleShadingEnable;
  fVar7 = multisampleStateParams->minSampleShading;
  pVVar2 = multisampleStateParams->pSampleMask;
  VVar8 = multisampleStateParams->alphaToCoverageEnable;
  VVar9 = multisampleStateParams->alphaToOneEnable;
  (this->m_multisampleStateParams).sType = multisampleStateParams->sType;
  *(undefined4 *)&(this->m_multisampleStateParams).field_0x4 = uVar3;
  (this->m_multisampleStateParams).pNext = pvVar1;
  (this->m_multisampleStateParams).flags = VVar4;
  (this->m_multisampleStateParams).rasterizationSamples = VVar5;
  (this->m_multisampleStateParams).sampleShadingEnable = VVar6;
  (this->m_multisampleStateParams).minSampleShading = fVar7;
  (this->m_multisampleStateParams).pSampleMask = pVVar2;
  (this->m_multisampleStateParams).alphaToCoverageEnable = VVar8;
  (this->m_multisampleStateParams).alphaToOneEnable = VVar9;
  VVar10 = blendState->srcColorBlendFactor;
  VVar11 = blendState->dstColorBlendFactor;
  VVar12 = blendState->colorBlendOp;
  VVar13 = blendState->srcAlphaBlendFactor;
  VVar14 = blendState->dstAlphaBlendFactor;
  VVar15 = blendState->alphaBlendOp;
  VVar16 = blendState->colorWriteMask;
  (this->m_colorBlendState).blendEnable = blendState->blendEnable;
  (this->m_colorBlendState).srcColorBlendFactor = VVar10;
  (this->m_colorBlendState).dstColorBlendFactor = VVar11;
  (this->m_colorBlendState).colorBlendOp = VVar12;
  (this->m_colorBlendState).srcAlphaBlendFactor = VVar13;
  (this->m_colorBlendState).dstAlphaBlendFactor = VVar14;
  (this->m_colorBlendState).alphaBlendOp = VVar15;
  (this->m_colorBlendState).colorWriteMask = VVar16;
  local_38 = &this->m_colorImage;
  local_40 = &this->m_colorAttachmentView;
  local_48 = &this->m_resolveImage;
  local_50 = &this->m_resolveAttachmentView;
  local_58 = &this->m_depthStencilImage;
  local_60 = &this->m_renderPass;
  local_68 = &this->m_framebuffer;
  local_70 = &this->m_vertexShaderModule;
  local_78 = &this->m_fragmentShaderModule;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_colorAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_resolveImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_resolveImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_depthStencilImageAlloc).
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
       (Allocation *)0x0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
       = (VkDevice)0x0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal
       = 0;
  (this->m_depthStencilImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)0x0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)0x0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.
  m_internal = 0;
  (this->m_resolveAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  local_94[0] = topology;
  memset(&this->m_depthStencilAttachmentView,0,200);
  memset(&this->m_pipelineLayout,0,0x98);
  initialize(this,context,1,local_94,vertices);
  return;
}

Assistant:

MultisampleRenderer::MultisampleRenderer (Context&										context,
										  const VkFormat								colorFormat,
										  const tcu::IVec2&								renderSize,
										  const VkPrimitiveTopology						topology,
										  const std::vector<Vertex4RGBA>&				vertices,
										  const VkPipelineMultisampleStateCreateInfo&	multisampleStateParams,
										  const VkPipelineColorBlendAttachmentState&	blendState)
	: m_context					(context)
	, m_colorFormat				(colorFormat)
	, m_depthStencilFormat		(VK_FORMAT_UNDEFINED)
	, m_renderSize				(renderSize)
	, m_useDepth				(false)
	, m_useStencil				(false)
	, m_multisampleStateParams	(multisampleStateParams)
	, m_colorBlendState			(blendState)
{
	initialize(context, 1u, &topology, &vertices);
}